

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

Vec_Vec_t *
Saig_ManCexMinCollectReason
          (Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis,Vec_Vec_t *vFramePPs,int fPiReason)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  bool bVar4;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  undefined8 *puVar7;
  Vec_Int_t *vRoots;
  int *piVar8;
  uint uVar9;
  Vec_Int_t *vLeaves;
  Aig_Obj_t *pObj;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar1 = pCex->iFrame;
  uVar12 = (ulong)uVar1;
  uVar11 = uVar1 + 1;
  pVVar5 = (Vec_Vec_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar12) {
    uVar9 = uVar11;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = uVar9;
  if (uVar9 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)uVar9 << 3);
  }
  pVVar5->pArray = ppvVar6;
  if (-1 < (int)uVar1) {
    uVar13 = 0;
    do {
      puVar7 = (undefined8 *)malloc(0x10);
      *puVar7 = 0;
      puVar7[1] = 0;
      ppvVar6[uVar13] = puVar7;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  pVVar5->nSize = uVar11;
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 1000;
  vRoots->nSize = 0;
  piVar8 = (int *)malloc(4000);
  vRoots->pArray = piVar8;
  uVar13 = uVar12;
  if (-1 < (int)uVar1) {
    do {
      Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,vFramePPs,(int)uVar13,vRoots);
      if (uVar13 == (uint)pCex->iFrame) {
        vLeaves = (Vec_Int_t *)0x0;
      }
      else {
        if (vFrameCis->nSize <= (int)uVar13 + 1) {
LAB_00578b7c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        vLeaves = (Vec_Int_t *)vFrameCis->pArray[uVar13 + 1];
      }
      Saig_ManCexMinGetCos(pAig,pCex,vLeaves,vRoots);
      Aig_ManIncrementTravId(pAig);
      iVar2 = vRoots->nSize;
      if (0 < (long)iVar2) {
        piVar8 = vRoots->pArray;
        lVar10 = 0;
        do {
          pVVar3 = pAig->vObjs;
          if (pVVar3 == (Vec_Ptr_t *)0x0) {
            pObj = (Aig_Obj_t *)0x0;
          }
          else {
            uVar1 = piVar8[lVar10];
            if (((int)uVar1 < 0) || (pVVar3->nSize <= (int)uVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pObj = (Aig_Obj_t *)pVVar3->pArray[uVar1];
          }
          if ((long)uVar12 < (long)uVar13) goto LAB_00578b7c;
          Saig_ManCexMinCollectReason_rec(pAig,pObj,(Vec_Int_t *)ppvVar6[uVar13],fPiReason);
          lVar10 = lVar10 + 1;
        } while (iVar2 != lVar10);
      }
      bVar4 = 0 < (long)uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar4);
  }
  if (vRoots->pArray != (int *)0x0) {
    free(vRoots->pArray);
    vRoots->pArray = (int *)0x0;
  }
  free(vRoots);
  return pVVar5;
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectReason( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis, Vec_Vec_t * vFramePPs, int fPiReason )
{
    Vec_Vec_t * vFrameReas;
    Vec_Int_t * vRoots, * vLeaves;
    Aig_Obj_t * pObj;
    int i, f;
    // select reason for the property to fail
    vFrameReas = Vec_VecStart( pCex->iFrame+1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // set phase and polarity
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
        // create roots
        vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
        Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCexMinCollectReason_rec( pAig, pObj, Vec_VecEntryInt(vFrameReas, f), fPiReason );
//printf( "%d(%d) ", Vec_VecLevelSize(vFrameCis, f), Vec_VecLevelSize(vFrameReas, f) ); 
    }
//printf( "\n" );
    Vec_IntFree( vRoots );
    return vFrameReas;
}